

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SColor.h
# Opt level: O2

void __thiscall irr::video::SColorf::SColorf(SColorf *this,SColor c)

{
  this->r = (f32)((float)(c.color >> 0x10 & 0xff) * 0.003921569);
  this->g = (f32)((float)(c.color >> 8 & 0xff) * 0.003921569);
  this->b = (f32)((float)(c.color & 0xff) * 0.003921569);
  this->a = (f32)((float)(c.color >> 0x18) * 0.003921569);
  return;
}

Assistant:

u32 getRed() const { return (color >> 16) & 0xff; }